

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

void pnga_get_ghost_block(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  Integer proc;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int count [7];
  int stride_loc [7];
  int stride_rem [7];
  Integer llo [7];
  Integer ghi [7];
  Integer glo [7];
  Integer ldrem [7];
  
  lVar7 = g_a + 1000;
  proc = GAme;
  if (0 < (long)GA[g_a + 1000].p_handle) {
    proc = (Integer)PGRP_LIST[GA[g_a + 1000].p_handle].map_proc_list[GAme];
  }
  lVar13 = (long)GA[lVar7].ndim;
  pnga_distribution(g_a,proc,glo,ghi);
  lVar4 = 0;
  if (0 < lVar13) {
    lVar4 = lVar13;
  }
  lVar1 = lVar13 + -1;
  bVar3 = true;
  for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
    lVar11 = GA[g_a + 1000].width[lVar8];
    lVar10 = glo[lVar8] - lVar11;
    if (lo[lVar8] < lVar10) {
      bVar3 = false;
    }
    if (ghi[lVar8] + lVar11 < hi[lVar8]) {
      bVar3 = false;
    }
    llo[lVar8] = lVar10;
    if (lVar8 < lVar1) {
      ldrem[lVar8] = (lVar11 * 2 - glo[lVar8]) + ghi[lVar8] + 1;
    }
  }
  if (bVar3) {
    iVar5 = GA[lVar7].elemsize;
    lVar11 = (long)iVar5;
    lVar10 = 0;
    lVar8 = 0;
    if (0 < lVar1) {
      lVar8 = lVar1;
    }
    lVar12 = 1;
    for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
      lVar10 = lVar10 + (lo[lVar9] - llo[lVar9]) * lVar12;
      lVar12 = lVar12 * ((ghi[lVar9] - glo[lVar9]) + GA[g_a + 1000].width[lVar9] * 2 + 1);
    }
    lVar9 = lo[lVar13 + -1];
    lVar13 = *(long *)(stride_rem + lVar13 * 2 + 6);
    pcVar2 = GA[lVar7].ptr[proc];
    for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
      count[lVar7] = ((int)hi[lVar7] - (int)lo[lVar7]) + 1;
    }
    count[0] = count[0] * iVar5;
    iVar6 = iVar5;
    stride_loc[0] = iVar5;
    stride_rem[0] = iVar5;
    for (lVar7 = 0; lVar8 * 4 != lVar7; lVar7 = lVar7 + 4) {
      iVar6 = iVar6 * *(int *)((long)ldrem + lVar7 * 2);
      *(int *)((long)stride_rem + lVar7) = iVar6;
      iVar5 = iVar5 * *(int *)((long)ld + lVar7 * 2);
      *(int *)((long)stride_loc + lVar7) = iVar5;
      *(int *)((long)stride_rem + lVar7 + 4) = iVar6;
      *(int *)((long)stride_loc + lVar7 + 4) = iVar5;
    }
    ARMCI_GetS(pcVar2 + ((lVar9 - lVar13) * lVar12 + lVar10) * lVar11,stride_rem,buf,stride_loc,
               count,(int)lVar1,(int)proc);
  }
  else {
    pnga_periodic(g_a,lo,hi,buf,ld,(void *)0x0,1);
  }
  return;
}

Assistant:

void pnga_get_ghost_block(Integer g_a,
                               Integer *lo,
                               Integer *hi,
                               void *buf,
                               Integer *ld)
{
  /* g_a:      Global array handle
     lo[]:     Array of lower indices of patch of global array
     hi[]:     Array of upper indices of patch of global array
     buf[]:    Local buffer that array patch will be copied into
     ld[]:     Array of physical ndim-1 dimensions of local buffer */
  Integer handle=GA_OFFSET + g_a, ndim;
  Integer i, glo[MAXDIM], ghi[MAXDIM], ichk, me, grp_id;
  Integer llo[MAXDIM];
  int  stride_rem[MAXDIM], stride_loc[MAXDIM], count[MAXDIM];
  Integer ldrem[MAXDIM];
  Integer offset, factor, size;
  char *ptr;

  me = GAme;
  grp_id = (Integer)GA[handle].p_handle;
  if (grp_id>0) me = PGRP_LIST[grp_id].map_proc_list[me];
  ndim = GA[handle].ndim;

  /* Figure out whether or not lo and hi can be accessed completely
     from local data */
  pnga_distribution(g_a, me, glo, ghi);
  ichk = 1;
  for (i=0; i<ndim; i++) {
    if (lo[i] < glo[i]-(Integer)GA[handle].width[i]) ichk = 0;
    if (hi[i] > ghi[i]+(Integer)GA[handle].width[i]) ichk = 0;
    llo[i] = glo[i] - (Integer)GA[handle].width[i];
    if (i<ndim-1) ldrem[i] = ghi[i] - glo[i] + 1
      + 2*(Integer)GA[handle].width[i];
  }

  /* Get data. Use local copy if possible, otherwise use a periodic get */
  if (ichk) {
    offset = 0;
    factor = 1;
    size = GA[handle].elemsize;
    for (i=0; i<ndim-1; i++) {
      offset += (lo[i]-llo[i])*factor;
      factor *= ghi[i] - glo[i] + 1 + 2*(Integer)GA[handle].width[i];
    }
    offset += (lo[ndim-1]-llo[ndim-1])*factor;
    ptr = GA[handle].ptr[me] + size*offset;
    /* compute number of elements in each dimension and store result in count */
    gam_ComputeCount(ndim, lo, hi, count);

    /* scale first element in count by element size. The ARMCI_GetS
       routine uses this convention to figure out memory sizes.*/
    count[0] *= size;

    /* Return strides for memory containing global array on remote
       processor indexed by proc (stride_rem) and for local buffer
       buf (stride_loc) */
    gam_setstride(ndim, size, ld, ldrem, stride_rem, stride_loc);
    ARMCI_GetS(ptr,stride_rem,buf,stride_loc,count,ndim-1,me);
  } else {
    pnga_periodic(g_a,lo,hi,buf,ld,NULL,PERIODIC_GET);
  }
}